

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_sse_copy2str(FIOBJ dest,char *prefix,size_t pre_len,fio_str_info_s data)

{
  char *pcVar1;
  size_t len;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  if (data.len != 0) {
    pcVar1 = data.data + data.len;
    while (data.len != 0) {
      fiobj_str_write(dest,prefix,pre_len);
      lVar3 = -data.len;
      len = 0;
      for (pcVar2 = data.data; ((pcVar2 < pcVar1 && (*pcVar2 != '\n')) && (*pcVar2 != '\r'));
          pcVar2 = pcVar2 + 1) {
        lVar3 = lVar3 + 1;
        len = len + 1;
      }
      fiobj_str_write(dest,data.data,len);
      fiobj_str_write(dest,"\r\n",2);
      lVar4 = (ulong)(pcVar2[*pcVar2 == '\r'] == '\n') + (ulong)(*pcVar2 == '\r');
      data.data = pcVar2 + lVar4;
      data.len = -(lVar4 + lVar3);
    }
  }
  return;
}

Assistant:

static inline void http_sse_copy2str(FIOBJ dest, char *prefix, size_t pre_len,
                                     fio_str_info_s data) {
  if (!data.len)
    return;
  const char *stop = data.data + data.len;
  while (data.len) {
    fiobj_str_write(dest, prefix, pre_len);
    char *pos = data.data;
    while (pos < stop && *pos != '\n' && *pos != '\r')
      ++pos;
    fiobj_str_write(dest, data.data, (uintptr_t)(pos - data.data));
    fiobj_str_write(dest, "\r\n", 2);
    if (*pos == '\r')
      ++pos;
    if (*pos == '\n')
      ++pos;
    data.len -= (uintptr_t)(pos - data.data);
    data.data = pos;
  }
}